

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O3

void __thiscall
vkt::
InstanceFactory1<vkt::FunctionInstance1<vkt::image::(anonymous_namespace)::CaseDef>,_vkt::FunctionInstance1<vkt::image::(anonymous_namespace)::CaseDef>::Args,_vkt::FunctionPrograms1<vkt::image::(anonymous_namespace)::CaseDef>_>
::initPrograms(InstanceFactory1<vkt::FunctionInstance1<vkt::image::(anonymous_namespace)::CaseDef>,_vkt::FunctionInstance1<vkt::image::(anonymous_namespace)::CaseDef>::Args,_vkt::FunctionPrograms1<vkt::image::(anonymous_namespace)::CaseDef>_>
               *this,SourceCollections *dst)

{
  CaseDef CVar1;
  undefined1 auVar2 [12];
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffff8;
  
  auVar2 = *(undefined1 (*) [12])&(this->m_arg0).arg0.texture.m_layerSize;
  uVar3 = (this->m_arg0).arg0.texture.m_type;
  uVar4 = (this->m_arg0).arg0.texture.m_numLayers;
  uVar5 = (this->m_arg0).arg0.texture.m_numSamples;
  CVar1.texture.m_numSamples = uVar5;
  CVar1.texture.m_numLayers = uVar4;
  CVar1.texture.m_type = uVar3;
  CVar1.texture.m_layerSize.m_data = (int  [3])auVar2;
  uVar6 = (this->m_arg0).arg0.format;
  uVar7 = (this->m_arg0).arg0.numSamples;
  CVar1.numSamples = uVar7;
  CVar1.format = uVar6;
  CVar1._33_3_ = (int3)((uint)in_stack_fffffffffffffff8 >> 8);
  CVar1.singleLayerBind = (this->m_arg0).arg0.singleLayerBind;
  (*(this->m_progs).m_func)(dst,CVar1);
  return;
}

Assistant:

void			initPrograms		(vk::SourceCollections& dst) const { m_progs.init(dst, m_arg0); }